

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplugin_p.h
# Opt level: O1

bool __thiscall QPluginParsedMetaData::setError(QPluginParsedMetaData *this,QString *errorString)

{
  Type TVar1;
  QCborContainerPrivate *pQVar2;
  Type TVar3;
  long in_FS_OFFSET;
  qint64 local_50;
  QCborContainerPrivate *local_48;
  Type local_40;
  qint64 local_38;
  QCborContainerPrivate *pQStack_30;
  Type local_28;
  undefined4 uStack_24;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QCborValue::QCborValue((QCborValue *)&local_50,errorString);
  TVar3 = local_40;
  pQVar2 = local_48;
  local_48 = (QCborContainerPrivate *)0x0;
  local_40 = 0x117;
  local_38 = (this->data).n;
  (this->data).n = local_50;
  pQStack_30 = (this->data).container;
  (this->data).container = pQVar2;
  TVar1 = (this->data).t;
  (this->data).t = TVar3;
  _local_28 = CONCAT44(0xaaaaaaaa,TVar1);
  QCborValue::~QCborValue((QCborValue *)&local_38);
  QCborValue::~QCborValue((QCborValue *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool setError(const QString &errorString) Q_DECL_COLD_FUNCTION
    {
        data = errorString;
        return false;
    }